

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O1

void map_suite::test_nonobject_bool_two(void)

{
  mapped_type *pmVar1;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> value;
  oarchive ar;
  ostringstream result;
  key_type local_238;
  undefined4 uStack_234;
  long local_228 [2];
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  local_218;
  basic_oarchive<char> local_1e8;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            (&local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_218._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_218._M_impl.super__Rb_tree_header._M_header;
  local_218._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_218._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_218._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_238 = 2;
  local_218._M_impl.super__Rb_tree_header._M_header._M_right =
       local_218._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar1 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                       *)&local_218,&local_238);
  *pmVar1 = true;
  local_238 = 4;
  pmVar1 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                       *)&local_218,&local_238);
  *pmVar1 = false;
  trial::protocol::serialization::
  save_overloader<trial::protocol::json::basic_oarchive<char>,_std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>,_void>
  ::save(&local_1e8,
         (map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *)&local_218,
         0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[21]>
            ("result.str()","\"[[2,true],[4,false]]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x21d,"void map_suite::test_nonobject_bool_two()",&local_238,"[[2,true],[4,false]]");
  if ((long *)CONCAT44(uStack_234,local_238) != local_228) {
    operator_delete((long *)CONCAT44(uStack_234,local_238),local_228[0] + 1);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::~_Rb_tree(&local_218);
  local_1e8.super_common_oarchive<trial::protocol::json::basic_oarchive<char>_>._0_8_ =
       &PTR_vsave_001248d0;
  if (local_1e8.writer.stack.c.
      super__Vector_base<trial::protocol::json::basic_writer<char,_16UL>::frame,_std::allocator<trial::protocol::json::basic_writer<char,_16UL>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.writer.stack.c.
                    super__Vector_base<trial::protocol::json::basic_writer<char,_16UL>::frame,_std::allocator<trial::protocol::json::basic_writer<char,_16UL>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.writer.stack.c.
                          super__Vector_base<trial::protocol::json::basic_writer<char,_16UL>::frame,_std::allocator<trial::protocol::json::basic_writer<char,_16UL>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.writer.stack.c.
                          super__Vector_base<trial::protocol::json::basic_writer<char,_16UL>::frame,_std::allocator<trial::protocol::json::basic_writer<char,_16UL>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (**(code **)local_1e8.writer.encoder.storage._0_8_)();
  boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)&local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void test_nonobject_bool_two()
{
    std::ostringstream result;
    json::oarchive ar(result);
    std::map<int, bool> value;
    value[2] = true;
    value[4] = false;
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[[2,true],[4,false]]");
}